

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader::~LibraryEffectsLoader(LibraryEffectsLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LibraryImagesLoader).super_FilePartLoader.super_IFilePartLoader.super_ExtraDataLoader
  ._vptr_ExtraDataLoader = (_func_int **)&PTR__LibraryEffectsLoader_00910020;
  pcVar2 = (this->mSecondKey)._M_dataplus._M_p;
  paVar1 = &(this->mSecondKey).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSamplersMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSidSamplerInfoMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~_Rb_tree(&(this->mEffectSidSamplerInfoMap)._M_t);
  pcVar2 = (this->mCurrentSamplerSource)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentSamplerSource).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~_Rb_tree(&(this->mEffectProfileSidSurfaceMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~_Rb_tree(&(this->mEffectSidSurfaceMap)._M_t);
  pcVar2 = (this->mCurrentSurfaceInitFrom)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentSurfaceInitFrom).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  COLLADAFW::UniqueId::~UniqueId(&(this->mCurrentSurface).imageUniqueId);
  pcVar2 = (this->mCurrentNewParamSid)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentNewParamSid).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->mTransparency).super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__FloatOrParam_00910390;
  COLLADAFW::Param::~Param(&(this->mTransparency).mParam);
  (this->mTransparency).super_Animatable._vptr_Animatable = (_func_int **)&PTR__Animatable_00910370;
  COLLADAFW::UniqueId::~UniqueId(&(this->mTransparency).super_Animatable.mAnimationList);
  COLLADAFW::Texture::~Texture(&(this->mTransparent).mTexture);
  (this->mTransparent).mColor.super_Animatable._vptr_Animatable = (_func_int **)&PTR__Color_00910328
  ;
  pcVar2 = (this->mTransparent).mColor.mSid._M_dataplus._M_p;
  paVar1 = &(this->mTransparent).mColor.mSid.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->mTransparent).mColor.super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__Animatable_00910370;
  COLLADAFW::UniqueId::~UniqueId(&(this->mTransparent).mColor.super_Animatable.mAnimationList);
  LibraryImagesLoader::~LibraryImagesLoader(&this->super_LibraryImagesLoader);
  return;
}

Assistant:

LibraryEffectsLoader::~LibraryEffectsLoader()
	{
	}